

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalFederateId.hpp
# Opt level: O1

void __thiscall
helics::BaseTimeCoordinator::setAsParent(BaseTimeCoordinator *this,GlobalFederateId fedID)

{
  DependencyInfo *pDVar1;
  
  if (((this->mSourceId).gid != fedID.gid) &&
     (pDVar1 = TimeDependencies::getDependencyInfo(&this->dependencies,fedID),
     pDVar1 != (DependencyInfo *)0x0)) {
    pDVar1->connection = PARENT;
    this->noParent = false;
  }
  return;
}

Assistant:

constexpr bool operator==(GlobalFederateId id) const noexcept { return (gid == id.gid); }